

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O1

Vec_Ptr_t * Aig_ManTernarySimulate(Aig_Man_t *p,int fVerbose,int fVeryVerbose)

{
  byte bVar1;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  Aig_Tsi_t *p_00;
  ulong uVar5;
  uint *puVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  bool bVar17;
  
  p_00 = Aig_TsiStart(p);
  p->pConst1->field_0x1f = 2;
  uVar4 = p->nObjs[2] - p->nRegs;
  uVar5 = (ulong)uVar4;
  if (uVar4 != 0 && p->nRegs <= p->nObjs[2]) {
    lVar10 = 0;
    do {
      if (p->vCis->nSize <= lVar10) goto LAB_006cc5e4;
      pvVar2 = p->vCis->pArray[lVar10];
      *(ulong *)((long)pvVar2 + 0x18) =
           *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffff | 0x300000000000000;
      lVar10 = lVar10 + 1;
      uVar5 = (long)p->nObjs[2] - (long)p->nRegs;
    } while (lVar10 < (long)uVar5);
  }
  pVVar7 = p->vCis;
  if ((int)uVar5 < pVVar7->nSize) {
    uVar11 = uVar5 & 0xffffffff;
    do {
      if ((int)uVar5 < 0) goto LAB_006cc5e4;
      *(ulong *)((long)pVVar7->pArray[uVar11] + 0x18) =
           (*(ulong *)((long)pVVar7->pArray[uVar11] + 0x18) & 0xffffffffffffff) + 0x100000000000000;
      uVar11 = uVar11 + 1;
      pVVar7 = p->vCis;
    } while ((int)uVar11 < pVVar7->nSize);
  }
  uVar4 = 0;
  do {
    puVar6 = Aig_TsiStateNew(p_00);
    iVar9 = p->nRegs;
    if (0 < iVar9) {
      bVar14 = 0;
      uVar12 = 0;
      do {
        iVar15 = (p->nObjs[3] - iVar9) + uVar12;
        if ((((iVar15 < 0) || (p->vCos->nSize <= iVar15)) ||
            (uVar16 = (p->nObjs[2] - iVar9) + uVar12, (int)uVar16 < 0)) ||
           (p->vCis->nSize <= (int)uVar16)) goto LAB_006cc5e4;
        bVar1 = *(byte *)((long)p->vCis->pArray[uVar16] + 0x1f);
        if ((bVar1 & 1) != 0) {
          puVar6[uVar12 >> 4] = puVar6[uVar12 >> 4] | 1 << (bVar14 & 0x1e);
        }
        if ((bVar1 & 2) != 0) {
          puVar6[uVar12 >> 4] = puVar6[uVar12 >> 4] | 2 << (bVar14 & 0x1e);
        }
        uVar12 = uVar12 + 1;
        iVar9 = p->nRegs;
        bVar14 = bVar14 + 2;
      } while ((int)uVar12 < iVar9);
    }
    if (fVeryVerbose != 0) {
      printf("%3d : ",(ulong)uVar4);
      Aig_TsiStatePrint(p_00,puVar6);
    }
    iVar9 = p_00->nWords;
    iVar15 = Aig_TsiStateLookup(p_00,puVar6,iVar9);
    if (iVar15 != 0) goto LAB_006cc227;
    Aig_TsiStateInsert(p_00,puVar6,iVar9);
    pVVar7 = p->vObjs;
    if (0 < pVVar7->nSize) {
      lVar10 = 0;
      do {
        pvVar2 = pVVar7->pArray[lVar10];
        if ((pvVar2 != (void *)0x0) &&
           (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7)) {
          bVar14 = (byte)((ulong)*(undefined8 *)
                                  ((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18) >>
                         0x38);
          uVar12 = (uint)bVar14;
          if ((*(ulong *)((long)pvVar2 + 8) & 1) != 0) {
            bVar14 = bVar14 - 1;
            if (2 < bVar14) goto LAB_006cc603;
            uVar12 = *(uint *)(&DAT_00a1abe0 + (ulong)bVar14 * 4);
          }
          bVar14 = (byte)((ulong)*(undefined8 *)
                                  ((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18) >>
                         0x38);
          uVar16 = (uint)bVar14;
          if ((*(ulong *)((long)pvVar2 + 0x10) & 1) != 0) {
            bVar14 = bVar14 - 1;
            if (2 < bVar14) goto LAB_006cc603;
            uVar16 = *(uint *)(&DAT_00a1abe0 + (ulong)bVar14 * 4);
          }
          uVar5 = 0x100000000000000;
          if ((((uVar12 != 1) && (uVar5 = 0x100000000000000, uVar16 != 1)) &&
              ((uVar5 = 0x300000000000000, uVar12 != 3 && (uVar5 = 0x300000000000000, uVar16 != 3)))
              ) && ((uVar12 != 2 || (uVar5 = 0x200000000000000, uVar16 != 2)))) {
            __assert_fail("Value0 == AIG_XVS1 && Value1 == AIG_XVS1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTsim.c"
                          ,0x37,"int Aig_XsimAnd(int, int)");
          }
          *(ulong *)((long)pvVar2 + 0x18) =
               *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffff | uVar5;
        }
        lVar10 = lVar10 + 1;
        pVVar7 = p->vObjs;
      } while (lVar10 < pVVar7->nSize);
    }
    uVar12 = p->nObjs[3] - p->nRegs;
    pVVar7 = p->vCos;
    if ((int)uVar12 < pVVar7->nSize) {
      uVar5 = (ulong)uVar12;
      do {
        if ((int)uVar12 < 0) goto LAB_006cc5e4;
        pvVar2 = pVVar7->pArray[uVar5];
        bVar14 = *(byte *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x1f);
        uVar11 = (ulong)bVar14;
        if ((*(ulong *)((long)pvVar2 + 8) & 1) != 0) {
          bVar14 = bVar14 - 1;
          if (2 < bVar14) {
LAB_006cc603:
            __assert_fail("Value == AIG_XVSX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTsim.c"
                          ,0x2e,"int Aig_XsimInv(int)");
          }
          uVar11 = *(ulong *)(&DAT_00a1abf0 + (ulong)bVar14 * 8);
        }
        *(ulong *)((long)pvVar2 + 0x18) =
             *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffff | uVar11 << 0x38;
        uVar5 = uVar5 + 1;
        pVVar7 = p->vCos;
      } while ((int)uVar5 < pVVar7->nSize);
    }
    iVar9 = p->nRegs;
    if (0 < iVar9) {
      iVar15 = 0;
      do {
        uVar12 = (p->nObjs[3] - iVar9) + iVar15;
        if (((((int)uVar12 < 0) || (p->vCos->nSize <= (int)uVar12)) ||
            (uVar16 = (p->nObjs[2] - iVar9) + iVar15, (int)uVar16 < 0)) ||
           (p->vCis->nSize <= (int)uVar16)) goto LAB_006cc5e4;
        pvVar2 = p->vCis->pArray[uVar16];
        uVar5 = *(ulong *)((long)p->vCos->pArray[uVar12] + 0x18);
        if (uVar4 < 300) {
          uVar11 = *(ulong *)((long)pvVar2 + 0x18);
          uVar13 = uVar5 & 0xff00000000000000;
LAB_006cc1f5:
          *(ulong *)((long)pvVar2 + 0x18) = uVar11 & 0xffffffffffffff | uVar13;
        }
        else {
          uVar11 = *(ulong *)((long)pvVar2 + 0x18);
          uVar13 = 0x300000000000000;
          if (0xffffffffffffff < (uVar5 ^ uVar11)) goto LAB_006cc1f5;
        }
        iVar15 = iVar15 + 1;
        iVar9 = p->nRegs;
      } while (iVar15 < iVar9);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 1000);
  uVar4 = 1000;
LAB_006cc227:
  if (uVar4 == 1000) {
    pVVar7 = (Vec_Ptr_t *)0x0;
    printf("Aig_ManTernarySimulate(): Did not reach a fixed point after %d iterations (not a bug).\n"
           ,1000);
    Aig_TsiStop(p_00);
  }
  else {
    if (p_00->vStates->nSize < 1) {
LAB_006cc5e4:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    puVar6 = (uint *)*p_00->vStates->pArray;
    Aig_TsiStateOrAll(p_00,puVar6);
    uVar12 = p_00->nWords;
    iVar9 = uVar12 * 0x20 + p->nRegs * -2;
    if (iVar9 == 0) {
      if ((int)uVar12 < 1) {
        bVar3 = false;
      }
      else {
        uVar5 = 0;
        bVar3 = false;
        do {
          if (puVar6[uVar5] != 0xffffffff) {
            bVar3 = true;
          }
          uVar5 = uVar5 + 1;
        } while (uVar12 != uVar5);
      }
    }
    else {
      if ((int)uVar12 < 2) {
        uVar5 = 0;
        bVar17 = false;
      }
      else {
        uVar5 = 0;
        bVar17 = false;
        do {
          if (puVar6[uVar5] != 0xffffffff) {
            bVar17 = true;
          }
          uVar5 = uVar5 + 1;
        } while (uVar12 - 1 != uVar5);
        uVar5 = (ulong)(uVar12 - 1);
      }
      bVar3 = true;
      if (puVar6[uVar5] == 0xffffffffU >> ((byte)iVar9 & 0x1f)) {
        bVar3 = bVar17;
      }
    }
    if (bVar3) {
      iVar9 = p->nObjs[2];
      pVVar7 = (Vec_Ptr_t *)malloc(0x10);
      iVar15 = 8;
      if (6 < iVar9 - 1U) {
        iVar15 = iVar9;
      }
      pVVar7->nSize = 0;
      pVVar7->nCap = iVar15;
      if (iVar15 == 0) {
        ppvVar8 = (void **)0x0;
      }
      else {
        ppvVar8 = (void **)malloc((long)iVar15 << 3);
      }
      pVVar7->pArray = ppvVar8;
      if (p->nRegs < p->nObjs[2]) {
        lVar10 = 0;
        do {
          if (p->vCis->nSize <= lVar10) goto LAB_006cc5e4;
          pvVar2 = p->vCis->pArray[lVar10];
          uVar12 = pVVar7->nSize;
          uVar16 = pVVar7->nCap;
          if (uVar12 == uVar16) {
            if ((int)uVar16 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
              }
              iVar9 = 0x10;
            }
            else {
              iVar9 = uVar16 * 2;
              if (iVar9 <= (int)uVar16) goto LAB_006cc405;
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc((ulong)uVar16 << 4);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar16 << 4);
              }
            }
            pVVar7->pArray = ppvVar8;
            pVVar7->nCap = iVar9;
          }
LAB_006cc405:
          pVVar7->nSize = uVar12 + 1;
          pVVar7->pArray[(int)uVar12] = pvVar2;
          lVar10 = lVar10 + 1;
        } while (lVar10 < (long)p->nObjs[2] - (long)p->nRegs);
      }
      iVar9 = p->nRegs;
      if (0 < iVar9) {
        iVar15 = p->nObjs[3] - iVar9;
        if (((-1 < iVar15) && (iVar15 < p->vCos->nSize)) &&
           ((iVar9 = p->nObjs[2] - iVar9, -1 < iVar9 && (iVar9 < p->vCis->nSize)))) {
          uVar4 = *puVar6 >> 1 & 1;
          bVar17 = (*puVar6 & 1) != 0;
          pVVar7 = (Vec_Ptr_t *)
                   (*(code *)(&DAT_00a1a9d0 +
                             *(int *)(&DAT_00a1a9d0 + (ulong)((uint)bVar17 + uVar4 * 2) * 4)))
                             (bVar17,(uint)bVar17 + uVar4 * 2 + -1,p->vCis,
                              &DAT_00a1a9d0 +
                              *(int *)(&DAT_00a1a9d0 + (ulong)((uint)bVar17 + uVar4 * 2) * 4));
          return pVVar7;
        }
        goto LAB_006cc5e4;
      }
      Aig_TsiStop(p_00);
      if (fVerbose != 0) {
        printf("Detected %d constants after %d iterations of ternary simulation.\n",0,(ulong)uVar4);
      }
    }
    else {
      if (fVerbose != 0) {
        printf("Detected 0 constants after %d iterations of ternary simulation.\n",(ulong)uVar4);
      }
      Aig_TsiStop(p_00);
      pVVar7 = (Vec_Ptr_t *)0x0;
    }
  }
  return pVVar7;
}

Assistant:

Vec_Ptr_t * Aig_ManTernarySimulate( Aig_Man_t * p, int fVerbose, int fVeryVerbose )
{
    Aig_Tsi_t * pTsi;
    Vec_Ptr_t * vMap;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    unsigned * pState;//, * pPrev;
    int i, f, fConstants, Value, nCounter, nRetired;
    // allocate the simulation manager
    pTsi = Aig_TsiStart( p );
    // initialize the values
    Aig_ObjSetXsim( Aig_ManConst1(p), AIG_XVS1 );
    Aig_ManForEachPiSeq( p, pObj, i )
        Aig_ObjSetXsim( pObj, AIG_XVSX );
    Aig_ManForEachLoSeq( p, pObj, i )
        Aig_ObjSetXsim( pObj, AIG_XVS0 );
    // simulate for the given number of timeframes
    for ( f = 0; f < TSI_MAX_ROUNDS; f++ )
    {
        // collect this state
        pState = Aig_TsiStateNew( pTsi );
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        {
            Value = Aig_ObjGetXsim(pObjLo);
            if ( Value & 1 )
                Abc_InfoSetBit( pState, 2 * i );
            if ( Value & 2 )
                Abc_InfoSetBit( pState, 2 * i + 1 );
        }

//        printf( "%d ", Aig_TsiStateCount(pTsi, pState) );
if ( fVeryVerbose )
{
printf( "%3d : ", f );
Aig_TsiStatePrint( pTsi, pState );
}
        // check if this state exists
        if ( Aig_TsiStateLookup( pTsi, pState, pTsi->nWords ) )
            break;
//        nCounter = 0;
//        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
//            nCounter += (Aig_ObjGetXsim(pObjLo) == AIG_XVS0);
//printf( "%d -> ", nCounter );
        // insert this state
        Aig_TsiStateInsert( pTsi, pState, pTsi->nWords );
        // simulate internal nodes
        Aig_ManForEachNode( p, pObj, i )
        {
            Aig_ObjSetXsim( pObj, Aig_XsimAnd(Aig_ObjGetXsimFanin0(pObj), Aig_ObjGetXsimFanin1(pObj)) );
//            printf( "%d %d    Id = %2d.  Value = %d.\n", 
//                Aig_ObjGetXsimFanin0(pObj), Aig_ObjGetXsimFanin1(pObj),
//                i, Aig_XsimAnd(Aig_ObjGetXsimFanin0(pObj), Aig_ObjGetXsimFanin1(pObj)) );
        }
        // transfer the latch values
        Aig_ManForEachLiSeq( p, pObj, i )
            Aig_ObjSetXsim( pObj, Aig_ObjGetXsimFanin0(pObj) );
        nCounter = 0;
        nRetired = 0;
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        {
            if ( f < TSI_ONE_SERIES )
                Aig_ObjSetXsim( pObjLo, Aig_ObjGetXsim(pObjLi) );
            else
            {
                if ( Aig_ObjGetXsim(pObjLi) != Aig_ObjGetXsim(pObjLo) )
                {
                    Aig_ObjSetXsim( pObjLo, AIG_XVSX );
                    nRetired++;
                }
            }
            nCounter += (Aig_ObjGetXsim(pObjLo) == AIG_XVS0);
        }
//        if ( nRetired )
//        printf( "Retired %d registers.\n", nRetired );

//        if ( f && (f % 1000 == 0) )
//            printf( "%d \n", f );
//printf( "%d  ", nCounter );
    }
//printf( "\n" );
    if ( f == TSI_MAX_ROUNDS )
    {
        printf( "Aig_ManTernarySimulate(): Did not reach a fixed point after %d iterations (not a bug).\n", TSI_MAX_ROUNDS );
        Aig_TsiStop( pTsi );
        return NULL;
    }
    // OR all the states
    pState = (unsigned *)Vec_PtrEntry( pTsi->vStates, 0 );
    Aig_TsiStateOrAll( pTsi, pState );
    // check if there are constants
    fConstants = 0;
    if ( 2*Aig_ManRegNum(p) == 32*pTsi->nWords )
    {
        for ( i = 0; i < pTsi->nWords; i++ )
            if ( pState[i] != ~0 )
                fConstants = 1;
    }
    else
    {
        for ( i = 0; i < pTsi->nWords - 1; i++ )
            if ( pState[i] != ~0 )
                fConstants = 1;
        if ( pState[i] != Abc_InfoMask( 2*Aig_ManRegNum(p) - 32*(pTsi->nWords-1) ) )
            fConstants = 1;
    }
    if ( fConstants == 0 )
    {
        if ( fVerbose )
        printf( "Detected 0 constants after %d iterations of ternary simulation.\n", f );
        Aig_TsiStop( pTsi );
        return NULL;
    }

    // start mapping by adding the true PIs
    vMap = Vec_PtrAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Vec_PtrPush( vMap, pObj );
    // find constant registers
    nCounter = 0;
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
        nCounter += (Value == 1 || Value == 2);
        if ( Value == 1 )
            Vec_PtrPush( vMap, Aig_ManConst0(p) );
        else if ( Value == 2 )
            Vec_PtrPush( vMap, Aig_ManConst1(p) );
        else if ( Value == 3 )
            Vec_PtrPush( vMap, pObjLo );
        else
            assert( 0 );
//        Aig_XsimPrint( stdout, Value );
    }
//    printf( "\n" );
    Aig_TsiStop( pTsi );
    if ( fVerbose )
    printf( "Detected %d constants after %d iterations of ternary simulation.\n", nCounter, f );
    return vMap;
}